

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O1

string * __thiscall
glcts::TextureBorderClampSamplingTexture<float,unsigned_char>::getFragmentShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  int iVar1;
  ostream *poVar2;
  TestError *this_00;
  char *pcVar3;
  string outType;
  string samplerType;
  string coordType;
  string outCommand;
  stringstream result;
  char *local_238;
  char *local_230;
  char local_228;
  undefined7 uStack_227;
  char *local_218;
  long local_210;
  char local_208;
  undefined7 uStack_207;
  char *local_1f8;
  char *local_1f0;
  char local_1e8;
  undefined7 uStack_1e7;
  char *local_1d8;
  char *local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1f0 = (char *)0x0;
  local_1e8 = '\0';
  local_210 = 0;
  local_208 = '\0';
  local_230 = (char *)0x0;
  local_228 = '\0';
  local_1d0 = (char *)0x0;
  local_1c8 = '\0';
  iVar1 = *(int *)((long)this + 0x2dc);
  local_238 = &local_228;
  local_218 = &local_208;
  local_1f8 = &local_1e8;
  local_1d8 = &local_1c8;
  if (iVar1 < 0x8236) {
    if ((iVar1 == 0x8058) || (iVar1 == 0x81a5)) {
LAB_00cd6862:
      pcVar3 = "";
LAB_00cd686c:
      std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)0x0,(ulong)pcVar3);
      iVar1 = *(int *)((long)this + 0x2d8);
      if (iVar1 == 0x8c1a) {
        std::__cxx11::string::_M_replace((ulong)&local_1f8,0,local_1f0,0x1b66e43);
      }
      else if (iVar1 == 0x806f) {
        std::__cxx11::string::_M_replace((ulong)&local_1f8,0,local_1f0,0x1b66e43);
      }
      else {
        if (iVar1 != 0xde1) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Not allowed texture target!",fixed_sample_locations_values + 1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                     ,0x32e);
          goto LAB_00cd6c25;
        }
        std::__cxx11::string::_M_replace((ulong)&local_1f8,0,local_1f0,0x1b66e24);
      }
      std::__cxx11::string::append((char *)&local_218);
      iVar1 = *(int *)((long)this + 0x2e0);
      if (iVar1 < 0x8235) {
        if (iVar1 == 0x8058) {
          std::__cxx11::string::_M_replace((ulong)&local_238,0,local_230,0x1b66e62);
          pcVar3 = "texture(test_sampler, texture_coords_out)";
LAB_00cd69ef:
          std::__cxx11::string::_M_replace((ulong)&local_1d8,0,local_1d0,(ulong)pcVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"${VERSION}\n\nprecision highp float;\nprecision highp ",
                     0x33);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_218,local_210);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n\nuniform ",0xb);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_218,local_210);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," test_sampler;\nin  ",0x13);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,local_1f8,(long)local_1f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," texture_coords_out;\nlayout(location = 0) out ",0x2e);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,local_238,(long)local_230);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2," color;\n\nvoid main()\n{\n   color = ",0x22);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,local_1d8,(long)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n}\n",4);
          std::__cxx11::stringbuf::str();
          if (local_1d8 != &local_1c8) {
            operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
          }
          if (local_238 != &local_228) {
            operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
          }
          if (local_218 != &local_208) {
            operator_delete(local_218,CONCAT71(uStack_207,local_208) + 1);
          }
          if (local_1f8 != &local_1e8) {
            operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
          }
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          return __return_storage_ptr__;
        }
        if (iVar1 == 0x8229) {
          std::__cxx11::string::_M_replace((ulong)&local_238,0,local_230,0x1b10a98);
          pcVar3 = "texture(test_sampler, texture_coords_out).x";
          goto LAB_00cd69ef;
        }
      }
      else {
        if (iVar1 == 0x8235) {
          std::__cxx11::string::_M_replace((ulong)&local_238,0,local_230,0x1c86081);
          pcVar3 = "int(texture(test_sampler, texture_coords_out).x)";
          goto LAB_00cd69ef;
        }
        if (iVar1 == 0x8236) {
          std::__cxx11::string::_M_replace((ulong)&local_238,0,local_230,0x1adb600);
          pcVar3 = "uint(texture(test_sampler, texture_coords_out).x)";
          goto LAB_00cd69ef;
        }
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not allowed internal format!",fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x349);
      goto LAB_00cd6c25;
    }
    if (iVar1 == 0x8235) {
      pcVar3 = "i";
      goto LAB_00cd686c;
    }
  }
  else if (iVar1 < 0x8cac) {
    if (iVar1 == 0x8236) {
      pcVar3 = "u";
      goto LAB_00cd686c;
    }
    if (iVar1 == 0x8814) goto LAB_00cd6862;
  }
  else if ((iVar1 == 0x9278) || (iVar1 == 0x8cac)) goto LAB_00cd6862;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Not allowed internal format",fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
             ,0x318);
LAB_00cd6c25:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string TextureBorderClampSamplingTexture<InputType, OutputType>::getFragmentShaderCode(void)
{
	std::stringstream result;
	std::string		  coordType;
	std::string		  samplerType;
	std::string		  outType;
	std::string		  outCommand;

	/* Check input texture format and prepare sampler prefix */
	switch (m_test_configuration.get_input_internal_format())
	{
	case GL_RGBA32F:
	case GL_RGBA8:
	case GL_DEPTH_COMPONENT32F:
	case GL_DEPTH_COMPONENT16:
	case GL_COMPRESSED_RGBA8_ETC2_EAC:
		samplerType = "";
		break;

	case GL_R32UI:
		samplerType = "u";
		break;

	case GL_R32I:
		samplerType = "i";
		break;

	default:
		throw tcu::TestError("Not allowed internal format", "", __FILE__, __LINE__);
	}

	/* Check input texture target and prepare approperiate texture coordinate type and sampler type */
	switch (m_test_configuration.get_target())
	{
	case GL_TEXTURE_2D:
		coordType = "vec2";
		samplerType += "sampler2D";
		break;

	case GL_TEXTURE_2D_ARRAY:
		coordType = "vec3";
		samplerType += "sampler2DArray";
		break;

	case GL_TEXTURE_3D:
		coordType = "vec3";
		samplerType += "sampler3D";
		break;

	default:
		throw tcu::TestError("Not allowed texture target!", "", __FILE__, __LINE__);
	}

	/* Check output texture format and prepare approperiate texel fetching method and output type */
	switch (m_test_configuration.get_output_internal_format())
	{
	case GL_RGBA8:
		outType	= "vec4";
		outCommand = "texture(test_sampler, texture_coords_out)";
		break;

	case GL_R8:
		outType	= "float";
		outCommand = "texture(test_sampler, texture_coords_out).x";
		break;

	case GL_R32UI:
		outType	= "uint";
		outCommand = "uint(texture(test_sampler, texture_coords_out).x)";
		break;

	case GL_R32I:
		outType	= "int";
		outCommand = "int(texture(test_sampler, texture_coords_out).x)";
		break;

	default:
		throw tcu::TestError("Not allowed internal format!", "", __FILE__, __LINE__);
	}

	result << "${VERSION}\n"
			  "\n"
			  "precision highp float;\n"
			  "precision highp "
		   << samplerType << ";\n"
							 "\n"
							 "uniform "
		   << samplerType << " test_sampler;\n"
							 "in  "
		   << coordType << " texture_coords_out;\n"
						   "layout(location = 0) out "
		   << outType << " color;\n"
						 "\n"
						 "void main()\n"
						 "{\n"
						 "   color = "
		   << outCommand << ";\n"
							"}\n";

	return result.str();
}